

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

int run_test_metrics_pool_events(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  void *pvVar4;
  void *extraout_RAX;
  uv_work_t *req;
  uv_work_t *req_00;
  uv_loop_t *unaff_RBX;
  uv_fs_t *puVar5;
  uv_buf_t *unaff_R14;
  int64_t eval_b_9;
  int64_t eval_b_11;
  char rdata;
  uv_metrics_t metrics;
  uv_getaddrinfo_t addrinfo_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_random_t random_req;
  uv_fs_t open_req;
  uv_prepare_t prepare;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  void *pvStackY_bc0;
  uv_loop_t *puStackY_bb8;
  uv_buf_t *puStackY_bb0;
  void *pvStackY_b98;
  uv_metrics_t uStackY_b90;
  uv_loop_t *puStackY_b10;
  undefined1 local_b00 [8];
  uv_loop_t *local_af8;
  undefined1 local_ae9;
  uv_metrics_t local_ae8;
  uv_getaddrinfo_t local_a68;
  uv_buf_t local_9c8;
  uv_fs_t local_9b8;
  uv_fs_t local_7f8;
  uv_random_t local_638;
  uv_fs_t local_5a8;
  uv_prepare_t local_3e8;
  undefined1 local_390 [896];
  
  puStackY_b10 = (uv_loop_t *)0x1a9a96;
  puVar3 = uv_default_loop();
  puStackY_b10 = (uv_loop_t *)0x1a9aa5;
  iVar1 = uv_loop_configure(puVar3,UV_METRICS_IDLE_TIME);
  local_5a8.data = (void *)(long)iVar1;
  local_9b8.data = (uv_loop_t *)0x0;
  if (local_5a8.data == (void *)0x0) {
    unaff_RBX = (uv_loop_t *)local_390;
    puStackY_b10 = (uv_loop_t *)0x1a9aec;
    uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)unaff_RBX,"test_file",(uv_fs_cb)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9af4;
    uv_fs_req_cleanup((uv_fs_t *)unaff_RBX);
    puStackY_b10 = (uv_loop_t *)0x1a9af9;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9b09;
    iVar1 = uv_prepare_init(puVar3,&local_3e8);
    local_5a8.data = (void *)(long)iVar1;
    local_9b8.data = (uv_loop_t *)0x0;
    if (local_5a8.data != (void *)0x0) goto LAB_001a9f2e;
    puStackY_b10 = (uv_loop_t *)0x1a9b49;
    iVar1 = uv_prepare_start(&local_3e8,fs_prepare_cb);
    local_5a8.data = (void *)(long)iVar1;
    local_9b8.data = (uv_loop_t *)0x0;
    if (local_5a8.data != (void *)0x0) goto LAB_001a9f43;
    pool_events_counter = 0;
    puStackY_b10 = (uv_loop_t *)0x1a9ba3;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&local_5a8,"test_file",0x41,0x180,(uv_fs_cb)0x0);
    local_9b8.data = (void *)(long)iVar1;
    local_7f8.data = (void *)0x0;
    if ((uv_loop_t *)local_9b8.data != (uv_loop_t *)0x0) goto LAB_001a9f58;
    local_9b8.data = (void *)local_5a8.result;
    local_7f8.data = (void *)0x0;
    unaff_RBX = (uv_loop_t *)local_5a8.result;
    if (local_5a8.result < 0) goto LAB_001a9f6d;
    puStackY_b10 = (uv_loop_t *)0x1a9c0e;
    uv_fs_req_cleanup(&local_5a8);
    puStackY_b10 = (uv_loop_t *)0x1a9c1f;
    local_9c8 = uv_buf_init(test_buf,0xd);
    unaff_R14 = &local_9c8;
    puStackY_b10 = (uv_loop_t *)0x1a9c33;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9c5c;
    iVar1 = uv_fs_write(puVar3,(uv_fs_t *)(local_390 + 0x1c0),(uv_os_fd_t)local_5a8.result,unaff_R14
                        ,1,0,fs_write_cb);
    local_9b8.data = (void *)(long)iVar1;
    local_7f8.data = (void *)0x0;
    if ((uv_loop_t *)local_9b8.data != (uv_loop_t *)0x0) goto LAB_001a9f82;
    puStackY_b10 = (uv_loop_t *)0x1a9c8d;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9cab;
    iVar1 = uv_fs_stat(puVar3,&local_9b8,"test_file",fs_stat_cb);
    local_7f8.data = (void *)(long)iVar1;
    local_a68.data = (_func_void_uv__work_ptr *)0x0;
    if (local_7f8.data != (void *)0x0) goto LAB_001a9f97;
    puStackY_b10 = (uv_loop_t *)0x1a9cdc;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9cfa;
    iVar1 = uv_fs_stat(puVar3,&local_7f8,"test_file",fs_stat_cb);
    local_a68.data = (void *)(long)iVar1;
    local_638.data = (void *)0x0;
    if ((_func_void_uv__work_ptr *)local_a68.data != (_func_void_uv__work_ptr *)0x0)
    goto LAB_001a9fac;
    puStackY_b10 = (uv_loop_t *)0x1a9d2b;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9d4f;
    iVar1 = uv_random(puVar3,&local_638,&local_ae9,1,0,fs_random_cb);
    local_a68.data = (void *)(long)iVar1;
    local_ae8.loop_count = 0;
    if ((_func_void_uv__work_ptr *)local_a68.data != (_func_void_uv__work_ptr *)0x0)
    goto LAB_001a9fc1;
    puStackY_b10 = (uv_loop_t *)0x1a9d7a;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9d9e;
    iVar1 = uv_getaddrinfo(puVar3,&local_a68,fs_addrinfo_cb,"example.invalid",(char *)0x0,
                           (addrinfo *)0x0);
    local_ae8.loop_count = (uint64_t)iVar1;
    local_b00 = (undefined1  [8])0x0;
    if ((uv_close_cb)local_ae8.loop_count != (uv_close_cb)0x0) goto LAB_001a9fd3;
    puStackY_b10 = (uv_loop_t *)0x1a9dc8;
    uv_sleep(100);
    puStackY_b10 = (uv_loop_t *)0x1a9dcd;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9dd7;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    local_ae8.loop_count = (uint64_t)iVar1;
    local_b00 = (undefined1  [8])0x0;
    if ((uv_close_cb)local_ae8.loop_count != (uv_close_cb)0x0) goto LAB_001a9fe2;
    puStackY_b10 = (uv_loop_t *)0x1a9dfc;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9e09;
    iVar1 = uv_metrics_info(puVar3,&local_ae8);
    local_b00 = (undefined1  [8])(long)iVar1;
    local_af8 = (uv_loop_t *)0x0;
    if (local_b00 != (undefined1  [8])0x0) goto LAB_001a9ff1;
    local_b00 = (undefined1  [8])local_ae8.events;
    local_af8 = (uv_loop_t *)0x7;
    if ((long)local_ae8.events < 7) goto LAB_001aa000;
    local_b00 = (undefined1  [8])local_ae8.events_waiting;
    local_af8 = (uv_loop_t *)0x4;
    if ((long)local_ae8.events_waiting < 4) goto LAB_001aa00f;
    local_b00 = (undefined1  [8])(long)pool_events_counter;
    local_af8 = (uv_loop_t *)0xffffffffffffffd6;
    if (local_b00 != (undefined1  [8])0xffffffffffffffd6) goto LAB_001aa01e;
    puStackY_b10 = (uv_loop_t *)0x1a9eaf;
    uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_390,"test_file",(uv_fs_cb)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9eb7;
    uv_fs_req_cleanup((uv_fs_t *)local_390);
    puStackY_b10 = (uv_loop_t *)0x1a9ebc;
    unaff_RBX = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9ed0;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStackY_b10 = (uv_loop_t *)0x1a9eda;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_b00 = (undefined1  [8])0x0;
    puStackY_b10 = (uv_loop_t *)0x1a9ee8;
    puVar3 = uv_default_loop();
    puStackY_b10 = (uv_loop_t *)0x1a9ef0;
    iVar1 = uv_loop_close(puVar3);
    local_af8 = (uv_loop_t *)(long)iVar1;
    if (local_b00 == (undefined1  [8])local_af8) {
      puStackY_b10 = (uv_loop_t *)0x1a9f0c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_b10 = (uv_loop_t *)0x1a9f2e;
    run_test_metrics_pool_events_cold_1();
LAB_001a9f2e:
    puStackY_b10 = (uv_loop_t *)0x1a9f43;
    run_test_metrics_pool_events_cold_2();
LAB_001a9f43:
    puStackY_b10 = (uv_loop_t *)0x1a9f58;
    run_test_metrics_pool_events_cold_3();
LAB_001a9f58:
    puStackY_b10 = (uv_loop_t *)0x1a9f6d;
    run_test_metrics_pool_events_cold_4();
LAB_001a9f6d:
    puStackY_b10 = (uv_loop_t *)0x1a9f82;
    run_test_metrics_pool_events_cold_16();
LAB_001a9f82:
    puStackY_b10 = (uv_loop_t *)0x1a9f97;
    run_test_metrics_pool_events_cold_5();
LAB_001a9f97:
    puStackY_b10 = (uv_loop_t *)0x1a9fac;
    run_test_metrics_pool_events_cold_6();
LAB_001a9fac:
    puStackY_b10 = (uv_loop_t *)0x1a9fc1;
    run_test_metrics_pool_events_cold_7();
LAB_001a9fc1:
    puStackY_b10 = (uv_loop_t *)0x1a9fd3;
    run_test_metrics_pool_events_cold_8();
LAB_001a9fd3:
    puStackY_b10 = (uv_loop_t *)0x1a9fe2;
    run_test_metrics_pool_events_cold_9();
LAB_001a9fe2:
    puStackY_b10 = (uv_loop_t *)0x1a9ff1;
    run_test_metrics_pool_events_cold_10();
LAB_001a9ff1:
    puStackY_b10 = (uv_loop_t *)0x1aa000;
    run_test_metrics_pool_events_cold_11();
LAB_001aa000:
    puStackY_b10 = (uv_loop_t *)0x1aa00f;
    run_test_metrics_pool_events_cold_15();
LAB_001aa00f:
    puStackY_b10 = (uv_loop_t *)0x1aa01e;
    run_test_metrics_pool_events_cold_14();
LAB_001aa01e:
    puStackY_b10 = (uv_loop_t *)0x1aa02d;
    run_test_metrics_pool_events_cold_12();
  }
  puVar3 = (uv_loop_t *)local_b00;
  puStackY_b10 = (uv_loop_t *)fs_prepare_cb;
  run_test_metrics_pool_events_cold_13();
  puStackY_b10 = unaff_RBX;
  loop = uv_default_loop();
  iVar1 = uv_metrics_info(loop,&uStackY_b90);
  pvStackY_b98 = (void *)(long)iVar1;
  if (pvStackY_b98 != (void *)0x0) {
    puVar5 = (uv_fs_t *)&pvStackY_b98;
    fs_prepare_cb_cold_1();
    puStackY_bb8 = puVar3;
    puStackY_bb0 = unaff_R14;
    req = (uv_work_t *)malloc(0x80);
    req_00 = (uv_work_t *)malloc(0x80);
    pool_events_counter = pool_events_counter + 1;
    uv_fs_req_cleanup(puVar5);
    puVar3 = uv_default_loop();
    iVar1 = uv_queue_work(puVar3,req,fs_work_cb,fs_after_work_cb);
    pvStackY_bc0 = (void *)(long)iVar1;
    if (pvStackY_bc0 == (void *)0x0) {
      puVar3 = uv_default_loop();
      iVar1 = uv_queue_work(puVar3,req_00,fs_work_cb,fs_after_work_cb);
      pvStackY_bc0 = (void *)(long)iVar1;
      if (pvStackY_bc0 == (void *)0x0) {
        return iVar1;
      }
    }
    else {
      fs_write_cb_cold_1();
    }
    puVar5 = (uv_fs_t *)&pvStackY_bc0;
    fs_write_cb_cold_2();
    uv_fs_req_cleanup(puVar5);
    pool_events_counter = pool_events_counter + 1;
    return extraout_EAX;
  }
  pvVar4 = (void *)(ulong)(uint)pool_events_counter;
  pvStackY_b98 = (void *)0x0;
  if (pool_events_counter == 1) {
    pvStackY_b98 = (void *)uStackY_b90.events;
    pvVar4 = (void *)uStackY_b90.events;
    if (uStackY_b90.events == uStackY_b90.events_waiting) goto LAB_001aa0c0;
    fs_prepare_cb_cold_2();
    pvVar4 = extraout_RAX;
  }
  if (6 < (int)pvVar4) {
    uVar2 = uv_prepare_stop((uv_prepare_t *)puVar3);
    pvVar4 = (void *)(ulong)uVar2;
    pool_events_counter = -0x2a;
  }
LAB_001aa0c0:
  return (int)pvVar4;
}

Assistant:

TEST_IMPL(metrics_pool_events) {
  uv_buf_t iov;
  uv_fs_t open_req;
  uv_fs_t stat1_req;
  uv_fs_t stat2_req;
  uv_fs_t unlink_req;
  uv_fs_t write_req;
  uv_getaddrinfo_t addrinfo_req;
  uv_metrics_t metrics;
  uv_prepare_t prepare;
  uv_random_t random_req;
  uv_os_fd_t fd;
  int r;
  char rdata;

  ASSERT_OK(uv_loop_configure(uv_default_loop(), UV_METRICS_IDLE_TIME));

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  ASSERT_OK(uv_prepare_init(uv_default_loop(), &prepare));
  ASSERT_OK(uv_prepare_start(&prepare, fs_prepare_cb));

  pool_events_counter = 0;
  r = uv_fs_open(NULL,
                  &open_req, "test_file", UV_FS_O_WRONLY | UV_FS_O_CREAT,
                  S_IRUSR | S_IWUSR,
                  NULL);
  ASSERT_EQ(r, 0);
  ASSERT_GE(open_req.result, 0);
  fd = (uv_os_fd_t) open_req.result;
  uv_fs_req_cleanup(&open_req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  ASSERT_OK(uv_fs_write(uv_default_loop(),
                        &write_req,
                        fd,
                        &iov,
                        1,
                        0,
                        fs_write_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat1_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_fs_stat(uv_default_loop(),
                       &stat2_req,
                       "test_file",
                       fs_stat_cb));
  ASSERT_OK(uv_random(uv_default_loop(),
                      &random_req,
                      &rdata,
                      1,
                      0,
                      fs_random_cb));
  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &addrinfo_req,
                           fs_addrinfo_cb,
                           "example.invalid",
                           NULL,
                           NULL));

  /* Sleep for a moment to hopefully force the events to complete before
   * entering the event loop. */
  uv_sleep(100);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  /* It's possible for uv__work_done() to execute one extra time even though the
   * QUEUE has already been cleared out. This has to do with the way we use an
   * uv_async to tell the event loop thread to process the worker pool QUEUE. */
  ASSERT_GE(metrics.events, 7);
  /* It's possible one of the other events also got stuck in the event queue, so
   * check GE instead of EQ. Reason for 4 instead of 5 is because the call to
   * uv_getaddrinfo() is racey and slow. So can't guarantee that it'll always
   * execute before sleep completes. */
  ASSERT_GE(metrics.events_waiting, 4);
  ASSERT_EQ(pool_events_counter, -42);

  uv_fs_unlink(NULL, &unlink_req, "test_file", NULL);
  uv_fs_req_cleanup(&unlink_req);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}